

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_provider.cc
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uchar *in_RCX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t n;
  uchar *d_00;
  MD5 m;
  string initial;
  Digest d;
  string local_78;
  MD5 local_58;
  long *local_48;
  long local_38 [2];
  uchar local_28 [24];
  
  QPDFCryptoProvider::getDefaultProvider_abi_cxx11_();
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"potato","");
  QPDFCryptoProvider::registerImpl<Potato>(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"potato","");
  QPDFCryptoProvider::setDefaultProvider(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  QPDFCryptoProvider::getDefaultProvider_abi_cxx11_();
  d_00 = "potato";
  iVar2 = std::__cxx11::string::compare((char *)&local_78);
  if (iVar2 == 0) {
    n = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      d_00 = (uchar *)(local_78.field_2._M_allocated_capacity + 1);
      operator_delete(local_78._M_dataplus._M_p,(ulong)d_00);
      n = extraout_RDX_00;
    }
    MD5::MD5(&local_58,d_00,n,in_RCX);
    MD5::encodeString(&local_58,"quack");
    MD5::digest(&local_58,local_28);
    MD5::unparse_abi_cxx11_(&local_78,&local_58);
    iVar2 = std::__cxx11::string::compare((char *)&local_78);
    if (iVar2 == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"assertions passed\n",0x12);
      if (local_58.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_48 != local_38) {
        operator_delete(local_48,local_38[0] + 1);
      }
      return 0;
    }
    __assert_fail("m.unparse() == \"30313233343536373839616263646566\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/crypto_provider.cc"
                  ,0x5f,"int main()");
  }
  __assert_fail("QPDFCryptoProvider::getDefaultProvider() == \"potato\"",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/crypto_provider.cc"
                ,0x59,"int main()");
}

Assistant:

int
main()
{
    auto initial = QPDFCryptoProvider::getDefaultProvider();
    QPDFCryptoProvider::registerImpl<Potato>("potato");
    QPDFCryptoProvider::setDefaultProvider("potato");
    assert(QPDFCryptoProvider::getDefaultProvider() == "potato");
    MD5 m;
    m.encodeString("quack"); // anything
    MD5::Digest d;
    m.digest(d);
    // hex for 0123456789abcdef
    assert(m.unparse() == "30313233343536373839616263646566");
    std::cout << "assertions passed\n";
    return 0;
}